

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink.cc
# Opt level: O1

void __thiscall
google::protobuf::io::zc_sink_internal::ZeroCopyStreamByteSink::Append
          (ZeroCopyStreamByteSink *this,char *bytes,size_t len)

{
  int iVar1;
  ulong in_RAX;
  ulong __n;
  int size;
  undefined8 uStack_38;
  
  if ((len != 0) && (this->failed_ == false)) {
    uStack_38 = in_RAX;
    do {
      if (this->buffer_size_ == 0) {
        iVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&this->buffer_,(long)&uStack_38 + 4);
        if ((char)iVar1 == '\0') {
          this->buffer_size_ = 0;
          this->failed_ = true;
          return;
        }
        this->buffer_size_ = uStack_38 >> 0x20;
      }
      __n = this->buffer_size_;
      if (len <= this->buffer_size_) {
        __n = len;
      }
      memcpy(this->buffer_,bytes,__n);
      this->buffer_ = (void *)((long)this->buffer_ + __n);
      this->buffer_size_ = this->buffer_size_ - __n;
      this->bytes_written_ = this->bytes_written_ + __n;
      if (this->failed_ != false) {
        return;
      }
      bytes = bytes + __n;
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

void ZeroCopyStreamByteSink::Append(const char* bytes, size_t len) {
  while (!failed_ && len > 0) {
    if (buffer_size_ == 0) {
      int size;
      if (!stream_->Next(&buffer_, &size)) {
        // There isn't a way for ByteSink to report errors.
        buffer_size_ = 0;
        failed_ = true;
        return;
      }
      buffer_size_ = static_cast<unsigned int>(size);
    }

    auto to_write = std::min(len, buffer_size_);
    memcpy(buffer_, bytes, to_write);

    buffer_ = static_cast<char*>(buffer_) + to_write;
    buffer_size_ -= to_write;

    bytes += to_write;
    len -= to_write;

    bytes_written_ += to_write;
  }
}